

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtree.cpp
# Opt level: O1

void __thiscall libDAI::JTree::runHUGIN(JTree *this)

{
  ulong *puVar1;
  pointer pTVar2;
  size_t sVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  bool bVar10;
  ulong uVar11;
  int iVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  pointer pDVar13;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined4 extraout_var_07;
  long lVar14;
  ulong uVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  long lVar19;
  undefined1 auVar20 [64];
  undefined1 auVar21 [64];
  undefined1 auVar22 [64];
  undefined1 auVar23 [64];
  double dVar24;
  double dVar25;
  TFactor<double> quot;
  Factor new_Qb;
  TFactor<double> local_a0;
  TFactor<double> local_68;
  
  iVar12 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])();
  if (*(long *)(CONCAT44(extraout_var,iVar12) + 0xe8) !=
      *(long *)(CONCAT44(extraout_var,iVar12) + 0xe0)) {
    lVar18 = 0;
    lVar19 = 0;
    uVar17 = 0;
    do {
      iVar12 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      TFactor<double>::operator=
                ((TFactor<double> *)
                 ((long)&(((this->_Qa).
                           super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                         super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar18),
                 (TFactor<double> *)(*(long *)(CONCAT44(extraout_var_00,iVar12) + 0xe0) + lVar19));
      uVar17 = uVar17 + 1;
      iVar12 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      lVar19 = lVar19 + 0x40;
      lVar18 = lVar18 + 0x38;
    } while (uVar17 < (ulong)(*(long *)(CONCAT44(extraout_var_01,iVar12) + 0xe8) -
                              *(long *)(CONCAT44(extraout_var_01,iVar12) + 0xe0) >> 6));
  }
  iVar12 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  if (*(long *)(CONCAT44(extraout_var_02,iVar12) + 0x100) !=
      *(long *)(CONCAT44(extraout_var_02,iVar12) + 0xf8)) {
    uVar17 = 0;
    auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    auVar21 = vbroadcastsd_avx512f(ZEXT816(0x3ff0000000000000));
    do {
      pTVar2 = (this->_Qb).
               super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      lVar18 = *(long *)&pTVar2[uVar17]._p._p.super__Vector_base<double,_std::allocator<double>_>;
      lVar19 = (long)pTVar2[uVar17]._p._p.super__Vector_base<double,_std::allocator<double>_>.
                     _M_impl.super__Vector_impl_data._M_finish - lVar18;
      if (lVar19 != 0) {
        lVar19 = lVar19 >> 3;
        auVar22 = vpbroadcastq_avx512f();
        uVar15 = 0;
        do {
          auVar23 = vpbroadcastq_avx512f();
          auVar23 = vporq_avx512f(auVar23,auVar20);
          uVar11 = vpcmpuq_avx512f(auVar23,auVar22,2);
          puVar1 = (ulong *)(lVar18 + uVar15 * 8);
          bVar4 = (bool)((byte)uVar11 & 1);
          bVar5 = (bool)((byte)(uVar11 >> 1) & 1);
          bVar6 = (bool)((byte)(uVar11 >> 2) & 1);
          bVar7 = (bool)((byte)(uVar11 >> 3) & 1);
          bVar8 = (bool)((byte)(uVar11 >> 4) & 1);
          bVar9 = (bool)((byte)(uVar11 >> 5) & 1);
          bVar10 = (bool)((byte)(uVar11 >> 6) & 1);
          *puVar1 = (ulong)bVar4 * auVar21._0_8_ | (ulong)!bVar4 * *puVar1;
          puVar1[1] = (ulong)bVar5 * auVar21._8_8_ | (ulong)!bVar5 * puVar1[1];
          puVar1[2] = (ulong)bVar6 * auVar21._16_8_ | (ulong)!bVar6 * puVar1[2];
          puVar1[3] = (ulong)bVar7 * auVar21._24_8_ | (ulong)!bVar7 * puVar1[3];
          puVar1[4] = (ulong)bVar8 * auVar21._32_8_ | (ulong)!bVar8 * puVar1[4];
          puVar1[5] = (ulong)bVar9 * auVar21._40_8_ | (ulong)!bVar9 * puVar1[5];
          puVar1[6] = (ulong)bVar10 * auVar21._48_8_ | (ulong)!bVar10 * puVar1[6];
          puVar1[7] = (uVar11 >> 7) * auVar21._56_8_ | (ulong)!SUB81(uVar11 >> 7,0) * puVar1[7];
          uVar15 = uVar15 + 8;
        } while ((lVar19 + (ulong)(lVar19 == 0) + 7 & 0xfffffffffffffff8) != uVar15);
      }
      uVar17 = uVar17 + 1;
      iVar12 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      auVar21 = vbroadcastsd_avx512f(ZEXT816(0x3ff0000000000000));
      auVar20 = vpmovsxbq_avx512f(ZEXT816(0x706050403020100));
    } while (uVar17 < (ulong)((*(long *)(CONCAT44(extraout_var_03,iVar12) + 0x100) -
                               *(long *)(CONCAT44(extraout_var_03,iVar12) + 0xf8) >> 3) *
                             -0x3333333333333333));
  }
  this->_logZ = 0.0;
  lVar18 = (long)(this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
           (long)(this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  if (lVar18 != 0) {
    lVar18 = lVar18 >> 4;
    do {
      lVar18 = lVar18 + -1;
      sVar3 = (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar18].n2;
      pTVar2 = (this->_Qa).
               super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar12 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      TFactor<double>::partSum
                (&local_68,pTVar2 + sVar3,
                 (VarSet *)(lVar18 * 0x28 + *(long *)(CONCAT44(extraout_var_04,iVar12) + 0xf8)));
      dVar24 = TProb<double>::normalize(&local_68._p,NORMPROB);
      dVar24 = log(dVar24);
      this->_logZ = dVar24 + this->_logZ;
      pTVar2 = (this->_Qb).
               super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      TFactor<double>::TFactor(&local_a0,&local_68);
      if ((long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        lVar14 = (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
        lVar19 = *(long *)&pTVar2[lVar18]._p._p.super__Vector_base<double,_std::allocator<double>_>;
        lVar16 = 0;
        do {
          dVar24 = *(double *)(lVar19 + lVar16 * 8);
          dVar25 = 0.0;
          if ((dVar24 != 0.0) || (NAN(dVar24))) {
            dVar25 = local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar16] / dVar24;
          }
          local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar16] = dVar25;
          lVar16 = lVar16 + 1;
        } while (lVar14 + (ulong)(lVar14 == 0) != lVar16);
      }
      TFactor<double>::operator*=
                ((this->_Qa).
                 super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                 (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                 _M_impl.super__Vector_impl_data._M_start[lVar18].n1,&local_a0);
      if (local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a0._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      TFactor<double>::operator=
                ((this->_Qb).
                 super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar18,&local_68);
      if (local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_68._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
    } while (lVar18 != 0);
  }
  pDVar13 = (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl
            .super__Vector_impl_data._M_start;
  if (pDVar13 ==
      (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    pTVar2 = (this->_Qa).
             super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start;
  }
  else {
    pTVar2 = (this->_Qa).
             super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>.
             _M_impl.super__Vector_impl_data._M_start + pDVar13->n1;
  }
  dVar24 = TProb<double>::normalize(&pTVar2->_p,NORMPROB);
  dVar24 = log(dVar24);
  this->_logZ = dVar24 + this->_logZ;
  pDVar13 = (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl
            .super__Vector_impl_data._M_start;
  if ((this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>._M_impl.
      super__Vector_impl_data._M_finish != pDVar13) {
    uVar17 = 0;
    do {
      sVar3 = pDVar13[uVar17].n1;
      pTVar2 = (this->_Qa).
               super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      iVar12 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      TFactor<double>::marginal
                (&local_68,pTVar2 + sVar3,
                 (VarSet *)(uVar17 * 0x28 + *(long *)(CONCAT44(extraout_var_05,iVar12) + 0xf8)),true
                );
      pTVar2 = (this->_Qb).
               super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      TFactor<double>::TFactor(&local_a0,&local_68);
      if ((long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != 0) {
        lVar19 = (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish -
                 (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start >> 3;
        lVar18 = *(long *)&pTVar2[uVar17]._p._p.super__Vector_base<double,_std::allocator<double>_>;
        lVar14 = 0;
        do {
          dVar24 = *(double *)(lVar18 + lVar14 * 8);
          dVar25 = 0.0;
          if ((dVar24 != 0.0) || (NAN(dVar24))) {
            dVar25 = local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar14] / dVar24;
          }
          local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start[lVar14] = dVar25;
          lVar14 = lVar14 + 1;
        } while (lVar19 + (ulong)(lVar19 == 0) != lVar14);
      }
      TFactor<double>::operator*=
                ((this->_Qa).
                 super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start +
                 (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar17].n2,&local_a0);
      if (local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_a0._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_a0._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      TFactor<double>::operator=
                ((this->_Qb).
                 super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + uVar17,&local_68);
      if (local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68._p._p.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_68._p._p.super__Vector_base<double,_std::allocator<double>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      if (local_68._vs._vars.super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_68._vs._vars.
                        super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_68._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage -
                        (long)local_68._vs._vars.
                              super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                              super__Vector_impl_data._M_start);
      }
      uVar17 = uVar17 + 1;
      pDVar13 = (this->_RTree).super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>.
                _M_impl.super__Vector_impl_data._M_start;
    } while (uVar17 < (ulong)((long)(this->_RTree).
                                    super__Vector_base<libDAI::DEdge,_std::allocator<libDAI::DEdge>_>
                                    ._M_impl.super__Vector_impl_data._M_finish - (long)pDVar13 >> 4)
            );
  }
  iVar12 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
  if (*(long *)(CONCAT44(extraout_var_06,iVar12) + 0xe8) !=
      *(long *)(CONCAT44(extraout_var_06,iVar12) + 0xe0)) {
    lVar18 = 0x20;
    uVar17 = 0;
    do {
      TProb<double>::normalize
                ((TProb<double> *)
                 ((long)&(((this->_Qa).
                           super__Vector_base<libDAI::TFactor<double>,_std::allocator<libDAI::TFactor<double>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->_vs)._vars.
                         super__Vector_base<libDAI::Var,_std::allocator<libDAI::Var>_>._M_impl.
                         super__Vector_impl_data._M_start + lVar18),NORMPROB);
      uVar17 = uVar17 + 1;
      iVar12 = (*(this->super_DAIAlgRG).super_InferenceAlgorithm._vptr_InferenceAlgorithm[5])(this);
      lVar18 = lVar18 + 0x38;
    } while (uVar17 < (ulong)(*(long *)(CONCAT44(extraout_var_07,iVar12) + 0xe8) -
                              *(long *)(CONCAT44(extraout_var_07,iVar12) + 0xe0) >> 6));
  }
  return;
}

Assistant:

void JTree::runHUGIN() {
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ )
            _Qa[alpha] = grm().OR(alpha);

        for( size_t beta = 0; beta < grm().nr_IRs(); beta++ )
            _Qb[beta].fill( 1.0 );

        // CollectEvidence
        _logZ = 0.0;
        for( size_t i = _RTree.size(); (i--) != 0; ) {
    //      Make outer region _RTree[i].n1 consistent with outer region _RTree[i].n2
    //      IR(i) = seperator OR(_RTree[i].n1) && OR(_RTree[i].n2)
            Factor new_Qb = _Qa[_RTree[i].n2].partSum( grm().IR( i ) );
            _logZ += log(new_Qb.normalize());
            _Qa[_RTree[i].n1] *= new_Qb.divided_by( _Qb[i] ); 
            _Qb[i] = new_Qb;
        }
        if( _RTree.empty() )
            _logZ += log(_Qa[0].normalize() );
        else
            _logZ += log(_Qa[_RTree[0].n1].normalize());

        // DistributeEvidence
        for( size_t i = 0; i < _RTree.size(); i++ ) {
    //      Make outer region _RTree[i].n2 consistent with outer region _RTree[i].n1
    //      IR(i) = seperator OR(_RTree[i].n1) && OR(_RTree[i].n2)
            Factor new_Qb = _Qa[_RTree[i].n1].marginal( grm().IR( i ) );
            _Qa[_RTree[i].n2] *= new_Qb.divided_by( _Qb[i] ); 
            _Qb[i] = new_Qb;
        }

        // Normalize
        for( size_t alpha = 0; alpha < grm().nr_ORs(); alpha++ )
            _Qa[alpha].normalize();
    }